

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O2

CalculateGrowingBlockSizeResult
calculateBlockSize(qsizetype capacity,qsizetype objectSize,qsizetype headerSize,
                  AllocationOption option)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong headerSize_00;
  CalculateGrowingBlockSizeResult CVar6;
  
  headerSize_00 = headerSize + 2;
  if (2 < objectSize) {
    headerSize_00 = headerSize;
  }
  if (option == Grow) {
    CVar6 = qCalculateGrowingBlockSize(capacity,objectSize,headerSize_00);
    capacity = CVar6.elementCount;
    lVar4 = CVar6.size;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = objectSize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = capacity;
    uVar3 = SUB168(auVar1 * auVar2,0);
    lVar4 = -1;
    if (SUB168(auVar1 * auVar2,8) == 0) {
      lVar5 = uVar3 + headerSize_00;
      if ((!CARRY8(uVar3,headerSize_00)) && (-1 < lVar5)) {
        lVar4 = lVar5;
      }
    }
  }
  CVar6.elementCount = capacity;
  CVar6.size = lVar4;
  return CVar6;
}

Assistant:

static inline CalculateGrowingBlockSizeResult
calculateBlockSize(qsizetype capacity, qsizetype objectSize, qsizetype headerSize, QArrayData::AllocationOption option)
{
    // Adjust the header size up to account for the trailing null for QString
    // and QByteArray. This is not checked for overflow because headers sizes
    // should not be anywhere near the overflow limit.
    constexpr qsizetype FooterSize = qMax(sizeof(QString::value_type), sizeof(QByteArray::value_type));
    if (objectSize <= FooterSize)
        headerSize += FooterSize;

    // allocSize = objectSize * capacity + headerSize, but checked for overflow
    // plus padded to grow in size
    if (option == QArrayData::Grow) {
        return qCalculateGrowingBlockSize(capacity, objectSize, headerSize);
    } else {
        return { qCalculateBlockSize(capacity, objectSize, headerSize), capacity };
    }
}